

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnBlockExpr(BinaryReaderIR *this,Type sig_type)

{
  Expr *pEVar1;
  Result RVar2;
  pointer __p;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)7>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)7>_>_>
  expr;
  _Head_base<0UL,_wabt::Expr_*,_false> local_30;
  Expr *local_28;
  
  MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>>();
  SetBlockDeclaration(this,(BlockDeclaration *)&local_28[1].loc.filename.size_,sig_type);
  pEVar1 = local_28;
  local_28 = (Expr *)0x0;
  local_30._M_head_impl = pEVar1;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_30);
  if (local_30._M_head_impl != (Expr *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Expr[1])();
  }
  local_30._M_head_impl = (Expr *)0x0;
  if (RVar2.enum_ != Error) {
    PushLabel(this,Block,(ExprList *)&pEVar1[3].loc.filename.size_,(Expr *)0x0);
  }
  if (local_28 != (Expr *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return (Result)(uint)(RVar2.enum_ == Error);
}

Assistant:

Result BinaryReaderIR::OnBlockExpr(Type sig_type) {
  auto expr = MakeUnique<BlockExpr>();
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::Block, expr_list);
  return Result::Ok;
}